

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# 04.cpp
# Opt level: O2

int main(void)

{
  ostream *poVar1;
  char *pcVar2;
  char *pcVar3;
  char *pcVar4;
  bool x;
  char eme [8];
  
  setlocale(6,"");
  builtin_strncpy(eme,"\x1b[1;37m",8);
  std::operator<<((ostream *)&std::cout,eme);
  poVar1 = std::operator<<((ostream *)&std::cout,anon_var_dwarf_72c);
  std::endl<char,std::char_traits<char>>(poVar1);
  std::operator<<((ostream *)&std::cout,"Nietzsche era antisemita?");
  std::istream::_M_extract<bool>((bool *)&std::cin);
  pcVar2 = anon_var_dwarf_79a;
  if (x) {
    pcVar2 = anon_var_dwarf_758;
  }
  pcVar3 = "que era absolutamente preconceituosa e desejava ";
  if (x) {
    pcVar3 = "Que carecia de superacao. Isso nada tinha haver com os Judeus ";
  }
  pcVar4 = "a todo custo, associar a imagem dele ao antisemitismo.";
  if (x) {
    pcVar4 = "especificamente.";
  }
  std::operator<<((ostream *)&std::cout,pcVar2);
  std::operator<<((ostream *)&std::cout,pcVar3);
  poVar1 = std::operator<<((ostream *)&std::cout,pcVar4);
  std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<((ostream *)&std::cout,
                           "--------------------------------------------------------");
  poVar1 = std::endl<char,std::char_traits<char>>(poVar1);
  std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<((ostream *)&std::cout,"Nietzsche acreditava em Deus?");
  std::endl<char,std::char_traits<char>>(poVar1);
  std::istream::_M_extract<bool>((bool *)&std::cin);
  pcVar2 = anon_var_dwarf_84a;
  if (x) {
    pcVar2 = anon_var_dwarf_808;
  }
  pcVar3 = "Estava de Deus. E com isso declarou: \'O ultimo verdadeiro ";
  if (x) {
    pcVar3 = "O Deus que era constantemente usado para promover  ";
  }
  pcVar4 = anon_var_dwarf_86a;
  if (x) {
    pcVar4 = anon_var_dwarf_834;
  }
  std::operator<<((ostream *)&std::cout,pcVar2);
  std::operator<<((ostream *)&std::cout,pcVar3);
  std::operator<<((ostream *)&std::cout,pcVar4);
  poVar1 = std::operator<<((ostream *)&std::cout,
                           "--------------------------------------------------------------");
  std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<((ostream *)&std::cout,"Nietzsche era Niilista? ");
  std::endl<char,std::char_traits<char>>(poVar1);
  std::istream::_M_extract<bool>((bool *)&std::cin);
  if (x) {
    std::operator<<((ostream *)&std::cout,
                    "Nietzsche se considerava Niilista quando partia do pressuposto ");
    std::operator<<((ostream *)&std::cout,anon_var_dwarf_8b6);
    pcVar2 = "Nos acompanha tambem o amor pela vontade e pela vida, acima de tudo.";
  }
  else {
    pcVar2 = "Errado. Leia os primeiros capitulos de \'ECCE HOMO\'";
  }
  poVar1 = std::operator<<((ostream *)&std::cout,pcVar2);
  std::endl<char,std::char_traits<char>>(poVar1);
  return 0;
}

Assistant:

int main()
{
    setlocale(LC_ALL, "");
    char eme[] = {0x1b, '[', '1', ';', '3', '7', 'm', 0};
    cout << eme;
    bool x;

    cout << "Responda as alternativas com 1 para sim e 0 para não: " << endl;
    cout << "Nietzsche era antisemita?";
    cin >> x;

    if (x == true)
    {
        cout << "Nooopz! Nietzsche falava que o homem em sí era incompleto. ";
        cout << "Que carecia de superacao. Isso nada tinha haver com os Judeus ";
        cout << "especificamente." << endl;
    }
    else
    {
        cout << "Isso! Na verdade, essa idéia foi criada pela irmã de Nietzsche ";
        cout << "que era absolutamente preconceituosa e desejava ";
        cout << "a todo custo, associar a imagem dele ao antisemitismo." << endl;
    }
    cout << "--------------------------------------------------------" << endl
         << endl;
    cout << "Nietzsche acreditava em Deus?" << endl;
    cin >> x;

    if (x == 1)
    {
        cout << "YESS!Nietzsche não acreditava no Deus criado pelo homem. ";
        cout << "O Deus que era constantemente usado para promover  ";
        cout << "guerras, dor e martírios involuntários.";
    }
    else
    {
        cout << "Resposta errada. Nietzsche sabia da distância que o homem ";
        cout << "Estava de Deus. E com isso declarou: 'O ultimo verdadeiro ";
        cout << "Cristao morreu na cruz', dentre outras declarações.";
    }

    cout << "--------------------------------------------------------------" << endl;
    cout << "Nietzsche era Niilista? " << endl;
    cin >> x;

    if (x == 1)
    {
        cout << "Nietzsche se considerava Niilista quando partia do pressuposto ";
        cout << "que quando assumimos o nada, não estamos sozinhos.";
        cout << "Nos acompanha tambem o amor pela vontade e pela vida, acima de tudo." << endl;
    }
    else
    {
        cout << "Errado. Leia os primeiros capitulos de 'ECCE HOMO'" << endl;
    }
    return 0;
}